

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

uint32_t membr_next_rarvm_number(memory_bit_reader *br)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 uStack_20;
  
  uVar1 = membr_bits(br,2);
  if (uVar1 == 2) {
    uStack_20 = 0x10;
  }
  else {
    if (uVar1 == 1) {
      uVar1 = membr_bits(br,8);
      if (uVar1 < 0x10) {
        uVar2 = membr_bits(br,4);
        uVar1 = uVar2 | uVar1 << 4 | 0xffffff00;
      }
      return uVar1;
    }
    if (uVar1 == 0) {
      uStack_20 = 4;
    }
    else {
      uStack_20 = 0x20;
    }
  }
  uVar1 = membr_bits(br,uStack_20);
  return uVar1;
}

Assistant:

static uint32_t
membr_next_rarvm_number(struct memory_bit_reader *br)
{
  uint32_t val;
  switch (membr_bits(br, 2))
  {
    case 0:
      return membr_bits(br, 4);
    case 1:
      val = membr_bits(br, 8);
      if (val >= 16)
        return val;
      return 0xFFFFFF00 | (val << 4) | membr_bits(br, 4);
    case 2:
      return membr_bits(br, 16);
    default:
      return membr_bits(br, 32);
  }
}